

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O0

void __thiscall helics::ConnectionFailure::~ConnectionFailure(ConnectionFailure *this)

{
  void *in_RDI;
  
  ~ConnectionFailure((ConnectionFailure *)0x49f768);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

explicit ConnectionFailure(std::string_view message = "failed to connect") noexcept:
        HelicsException(message)
    {
    }